

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  pointer pCVar3;
  pointer pMVar4;
  pointer pSVar5;
  type pMVar6;
  pointer module_00;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string asStack_a0 [32];
  iterator local_80;
  size_type local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  Enum local_54;
  _Type local_50;
  unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_> local_48;
  unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
  module_command_1;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> module_command;
  CommandPtr local_30;
  CommandPtr command;
  __single_object module;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module_local;
  WastParser *this_local;
  
  std::make_unique<wabt::Module>();
  bVar1 = PeekMatchLpar(this,Module);
  if (bVar1) {
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::
    unique_ptr<std::default_delete<wabt::Command>,void>
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)&local_30);
    RVar2 = ParseModuleCommand(this,(Script *)0x0,&local_30);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      bVar1 = true;
    }
    else {
      pCVar3 = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(&local_30);
      bVar1 = isa<wabt::ModuleCommand,wabt::Command>(pCVar3);
      if (bVar1) {
        cast<wabt::ModuleCommand,wabt::Command>((wabt *)&module_command_1,&local_30);
        pMVar4 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
                 operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                             *)&module_command_1);
        pMVar6 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::operator*
                           ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command
                           );
        Module::operator=(pMVar6,&pMVar4->module);
        std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
                  ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                   &module_command_1);
      }
      else {
        pCVar3 = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(&local_30)
        ;
        bVar1 = isa<wabt::ScriptModuleCommand,wabt::Command>(pCVar3);
        if (!bVar1) {
          __assert_fail("isa<ScriptModuleCommand>(command.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                        ,0x48d,"Result wabt::WastParser::ParseModule(std::unique_ptr<Module> *)");
        }
        cast<wabt::ScriptModuleCommand,wabt::Command>((wabt *)&local_48,&local_30);
        pSVar5 = std::
                 unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                 ::operator->(&local_48);
        pMVar6 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::operator*
                           ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command
                           );
        Module::operator=(pMVar6,&pSVar5->module);
        std::unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
        ::~unique_ptr(&local_48);
      }
      bVar1 = false;
    }
    std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::~unique_ptr(&local_30);
    if (bVar1) goto LAB_00191646;
  }
  else {
    local_50 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField((TokenTypePair)local_50);
    if (bVar1) {
      module_00 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                             &command);
      local_54 = (Enum)ParseModuleFieldList(this,module_00);
      bVar1 = Failed((Result)local_54);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_00191646;
      }
    }
    else {
      ConsumeIfLpar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"a module field",&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(asStack_a0,"a module",&local_c2);
      local_80 = &local_c0;
      local_78 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_c3);
      __l._M_len = local_78;
      __l._M_array = local_80;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_70,__l,&local_c3);
      ErrorExpected(this,&local_70,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_c3);
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
      do {
        local_f0 = local_f0 + -1;
        std::__cxx11::string::~string((string *)local_f0);
      } while (local_f0 != &local_c0);
      std::allocator<char>::~allocator(&local_c2);
      std::allocator<char>::~allocator(&local_c1);
    }
  }
  RVar2 = Expect(this,Eof);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar7 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::size(this->errors_);
    if (sVar7 == 0) {
      std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::operator=
                (out_module,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command
                );
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
LAB_00191646:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = std::make_unique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    if (isa<ModuleCommand>(command.get())) {
      auto module_command = cast<ModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    } else {
      assert(isa<ScriptModuleCommand>(command.get()));
      auto module_command = cast<ScriptModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    }
  } else if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}